

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O1

void __thiscall Interface::print_groups(Interface *this,ofstream *out)

{
  Interface *pIVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  Group g;
  vector<Point,_std::allocator<Point>_> local_60;
  Interface *local_48;
  long local_40;
  ulong local_38;
  
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    if (0 < (int)((ulong)((long)(this->plane).f.groups.
                                super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->plane).f.groups.
                               super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      lVar7 = 0;
      local_48 = this;
      do {
        pIVar1 = local_48;
        iVar3 = rand();
        iVar4 = rand();
        iVar5 = rand();
        local_40 = lVar7;
        std::vector<Point,_std::allocator<Point>_>::vector
                  (&local_60,
                   &(pIVar1->plane).f.groups.super__Vector_base<Group,_std::allocator<Group>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar7].points);
        if (0 < (int)((ulong)((long)local_60.super__Vector_base<Point,_std::allocator<Point>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_60.super__Vector_base<Point,_std::allocator<Point>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
          local_38 = (ulong)(uint)(iVar3 % 0x101);
          lVar7 = 0;
          lVar8 = 0;
          do {
            poVar6 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(local_60.super__Vector_base<Point,_std::allocator<Point>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar7));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            poVar6 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(local_60.super__Vector_base<Point,_std::allocator<Point>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->y + lVar7));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_38);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 % 0x101);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 % 0x101);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x18;
          } while (lVar8 < (int)((ulong)((long)local_60.
                                               super__Vector_base<Point,_std::allocator<Point>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_60.
                                              super__Vector_base<Point,_std::allocator<Point>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555);
        }
        if (local_60.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        lVar7 = local_40 + 1;
      } while (lVar7 < (int)((ulong)((long)(local_48->plane).f.groups.
                                           super__Vector_base<Group,_std::allocator<Group>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)(local_48->plane).f.groups.
                                          super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 3) * -0x55555555);
    }
    std::ofstream::close();
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Errors in opening",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

void Interface::print_groups(ofstream &out) {
    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) plane.f.groups.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Group g = plane.f.groups[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c
                    << " " << endl;
            }


        }
        out.close();
    }
}